

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O3

void ur_df(double *y,int N,char *alternative,int *klag,double *statistic,double *pval)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  double *oup;
  void *__src;
  double *res;
  double *y_00;
  void *__src_00;
  double *xin;
  reg_object obj;
  long lVar4;
  size_t __size;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  double *__dest;
  ulong uVar8;
  double *yin;
  long lVar9;
  double local_2a8;
  double dftable [48];
  double prob [8];
  double *local_58;
  double *local_50;
  
  prob[7] = 25.0;
  prob[5] = 0.975;
  prob[6] = 0.99;
  prob[3] = 0.9;
  prob[4] = 0.95;
  prob[1] = 0.05;
  prob[2] = 0.1;
  dftable[0x2f] = 0.01;
  prob[0] = 0.025;
  yin = &local_2a8;
  memcpy(yin,&DAT_001561a0,0x180);
  if (klag == (int *)0x0) {
    dVar2 = pow((double)N + -1.0,0.3333333333333333);
    uVar3 = (uint)dVar2;
  }
  else {
    uVar3 = *klag;
  }
  iVar5 = (N + -1) - (uVar3 + 1);
  uVar1 = (long)iVar5 + 1;
  oup = (double *)malloc((long)N * 8 - 8);
  __size = (long)iVar5 * 8 + 8;
  lVar9 = (long)(int)(uVar3 + 1);
  __src = malloc(__size * lVar9);
  res = (double *)malloc(__size);
  y_00 = (double *)malloc(__size);
  __src_00 = malloc(__size);
  xin = (double *)malloc(0x40);
  diff(y,N,1,oup);
  if (-1 < (int)uVar3) {
    lVar4 = 0;
    uVar6 = (ulong)uVar3;
    pvVar7 = __src;
    do {
      if (-1 < iVar5) {
        uVar8 = 0;
        do {
          *(double *)((long)pvVar7 + uVar8 * 8) = oup[(int)uVar6 + (int)uVar8];
          uVar8 = uVar8 + 1;
        } while ((uVar1 & 0xffffffff) != uVar8);
      }
      lVar4 = lVar4 + 1;
      pvVar7 = (void *)((long)pvVar7 + uVar1 * 8);
      uVar6 = uVar6 - 1;
    } while (lVar4 != lVar9);
  }
  memcpy(y_00,__src,__size);
  if (-1 < iVar5) {
    uVar6 = 0;
    do {
      *(double *)((long)__src_00 + uVar6 * 8) = (double)(int)(uVar3 + 1 + (int)uVar6);
      uVar6 = uVar6 + 1;
    } while ((uVar1 & 0xffffffff) != uVar6);
  }
  iVar5 = (int)uVar1;
  if ((int)uVar3 < 1) {
    local_58 = (double *)malloc(uVar1 * 0x18);
    local_50 = (double *)malloc(0x48);
    obj = reg_init(iVar5,3);
    memcpy(local_58,y + lVar9 + -1,__size);
    __dest = local_58 + uVar1;
    pvVar7 = __src_00;
  }
  else {
    uVar6 = (ulong)(uVar3 + 3);
    local_58 = (double *)malloc(__size * uVar6);
    local_50 = (double *)malloc(uVar6 * uVar6 * 8);
    obj = reg_init(iVar5,uVar3 + 3);
    memcpy(local_58,y + lVar9 + -1,__size);
    memcpy(local_58 + uVar1,__src_00,__size);
    __dest = local_58 + iVar5 * 2;
    __size = uVar3 * __size;
    pvVar7 = (void *)((long)__src + uVar1 * 8);
  }
  memcpy(__dest,pvVar7,__size);
  regress(obj,local_58,y_00,res,local_50,0.95);
  *statistic = *(double *)(obj + 1) / obj[1].sigma_lower;
  lVar9 = 0;
  do {
    dVar2 = interpolate_linear(prob + 7,yin,6,(double)(N + -1));
    xin[lVar9] = dVar2;
    lVar9 = lVar9 + 1;
    yin = yin + 6;
  } while (lVar9 != 8);
  dVar2 = interpolate_linear(xin,dftable + 0x2f,8,*statistic);
  iVar5 = strcmp(alternative,"stationary");
  if (iVar5 != 0) {
    iVar5 = strcmp(alternative,"explosive");
    if (iVar5 != 0) {
      puts("alternative accepts only two values - stationary and explosive ");
      exit(-1);
    }
    dVar2 = 1.0 - dVar2;
  }
  *pval = dVar2;
  if (klag != (int *)0x0) {
    *klag = uVar3;
  }
  free(oup);
  free(__src);
  free(res);
  free(y_00);
  free(__src_00);
  free(local_58);
  free(local_50);
  free(xin);
  free_reg(obj);
  return;
}

Assistant:

void ur_df(double *y, int N,const char* alternative, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    alternative - "stationary" or "explosive"

    klag - Length of the lag. Uses pow((double)N - 1.0, 1.0/3.0) if klag == NULL
    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int lag,lags,N1,i,j,N2,p,k,pN,tN,Nout,iter;
    double *x,*z,*res,*XX,*Y,*tt,*varcovar,*tablep;
    reg_object fit;
    double alpha,ssr,interp;
    double nT[6] = {25, 50, 100, 250, 500, 100000};
    double prob[8] ={0.01, 0.025, 0.05, 0.10, 0.90, 0.95, 0.975, 0.99};
    double dftable[48] = {-4.38, -4.15, -4.04, -3.99, -3.98, -3.96,-3.95, -3.80, -3.73, -3.69, -3.68, -3.66,-3.60, -3.50, -3.45,
     -3.43, -3.42, -3.41,-3.24, -3.18, -3.15, -3.13, -3.13, -3.12,-1.14, -1.19, -1.22, -1.23, -1.24, -1.25,-0.80, -0.87, -0.90, -0.92,
      -0.93, -0.94,-0.50, -0.58, -0.62, -0.64, -0.65, -0.66,-0.15, -0.24, -0.28, -0.31, -0.32, -0.33};// 8X6

    pN = 8;
    tN = 6;
    Nout = 50;

    lags = (klag == NULL) ? (int) pow((double)N - 1.0, 1.0/3.0) : *klag;

    alpha = 0.95;
    lag = lags;
    lags++;
    N1 = N - 1;
    N2 = N1 - lags + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*(N1-lags+1)*lags);
    res = (double*)malloc(sizeof(double)*N2);
    Y = (double*)malloc(sizeof(double)*N2);
    tt = (double*)malloc(sizeof(double)*N2);
    tablep = (double*)malloc(sizeof(double)*pN);

    diff(y,N,1,z);// z = y(t) - y(t-1)

    //mdisplay(z,1,N1);
    
    for(i = 0; i < lags;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags+j-i-1];
        }
    } 

    //mdisplay(x,lags,N1-lags+1);
    
    memcpy(Y,x,sizeof(double)*N2);

    for(i = 0; i < N2;++i) {
        tt[i] = (double) (i + lags);
    }
    

    if (lags > 1) {
        //lags 5
        p = lags + 2;
        XX = (double*)malloc(sizeof(double)*N2*p);
        varcovar = (double*)malloc(sizeof(double)*p*p);
        fit = reg_init(N2,p);
        memcpy(XX,y+lags-1,sizeof(double)*N2);
        memcpy(XX+N2,tt,sizeof(double)*N2);
        memcpy(XX+2*N2,x+N2,sizeof(double)*N2*(lags-1));
        regress(fit,XX,Y,res,varcovar,alpha);
    } else {
        p = 3;
        XX = (double*)malloc(sizeof(double)*N2*p);
        varcovar = (double*)malloc(sizeof(double)*p*p);
        fit = reg_init(N2,p);
        memcpy(XX,y+lags-1,sizeof(double)*N2);
        memcpy(XX+N2,tt,sizeof(double)*N2);
        regress(fit,XX,Y,res,varcovar,alpha);
    }

    *statistic = (fit->beta+1)->value / (fit->beta+1)->stdErr;

    for(i = 0; i < pN;++i) {
        iter = i * tN;
        tablep[i] = interpolate_linear(nT,dftable+iter,tN,(double)N1);
    }

    interp = interpolate_linear(tablep,prob,pN,*statistic);

    //printf("interp %g \n",interp);

    if (!strcmp(alternative,"stationary")) {
        *pval = interp;
    } else if (!strcmp(alternative,"explosive")) {
        *pval = 1.0 - interp;
    } else {
        printf("alternative accepts only two values - stationary and explosive \n");
        exit(-1);
    }

    if (klag != NULL) *klag = lags - 1;
    

    free(z);
    free(x);
    free(res);
    free(Y);
    free(tt);
    free(XX);
    free(varcovar);
    free(tablep);
    free_reg(fit);
}